

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltForCharException.cpp
# Opt level: O1

void __thiscall
antlr::NoViableAltForCharException::NoViableAltForCharException
          (NoViableAltForCharException *this,int c,string *fileName_,int line_,int column_)

{
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"NoViableAlt","");
  RecognitionException::RecognitionException
            (&this->super_RecognitionException,&local_50,fileName_,line_,column_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_RecognitionException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__RecognitionException_002fd6f8;
  this->foundChar = c;
  return;
}

Assistant:

NoViableAltForCharException::NoViableAltForCharException(
					int c,
               const ANTLR_USE_NAMESPACE(std)string& fileName_,
					int line_, int column_)
  : RecognitionException("NoViableAlt",fileName_,line_,column_),
    foundChar(c)
{
}